

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>::
Archive(FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
        *this,MemIOWriter *Writer)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  pointer pAVar4;
  pointer pAVar5;
  
  bVar1 = Kumu::MemIOWriter::WriteUi32BE
                    (Writer,(ui32_t)((ulong)((long)(this->
                                                  super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                                                  ).
                                                  super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->
                                                  super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                                                  ).
                                                  super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  if (bVar1) {
    bVar1 = Kumu::MemIOWriter::WriteUi32BE(Writer,2);
    if (bVar1) {
      pAVar5 = (this->super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>).
               super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pAVar4 = (this->super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>).
               super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar3 = 1;
      bVar2 = 1;
      if (pAVar5 != pAVar4) {
        for (; (bVar2 = (byte)uVar3, (uVar3 & 1) != 0 && (pAVar5 != pAVar4)); pAVar5 = pAVar5 + 1) {
          uVar3 = (*(pAVar5->super_IArchive)._vptr_IArchive[4])(pAVar5,Writer);
          pAVar4 = (this->super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>)
                   .super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      goto LAB_00194faa;
    }
  }
  bVar2 = 0;
LAB_00194faa:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    if ( ! Writer->WriteUi32BE((ui32_t)this->size()) ) return false;
	    if ( ! Writer->WriteUi32BE((ui32_t)this->ItemSize()) ) return false;
	    if ( this->empty() ) return true;
	    
	    typename ContainerType::const_iterator i;
	    bool result = true;
	    for ( i = this->begin(); i != this->end() && result; ++i )
	      {
		result = i->Archive(Writer);
	      }

	    return result;
	  }